

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

void __thiscall Rml::Element::UpdateDefinition(Element *this)

{
  undefined1 *puVar1;
  pointer puVar2;
  byte bVar3;
  ElementPtr *child;
  pointer puVar4;
  
  bVar3 = this->field_0x17;
  if ((bVar3 & 2) != 0) {
    this->field_0x17 = bVar3 & 0xf9 | 4;
    ElementStyle::UpdateDefinition(&this->meta->style);
    bVar3 = this->field_0x17;
  }
  if ((bVar3 & 4) != 0) {
    this->field_0x17 = bVar3 & 0xfb;
    puVar2 = (this->children).
             super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar4 = (this->children).
                  super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar2; puVar4 = puVar4 + 1)
    {
      puVar1 = &((puVar4->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                 _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                 super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl)->field_0x17;
      *puVar1 = *puVar1 | 2;
    }
  }
  return;
}

Assistant:

void Element::UpdateDefinition()
{
	if (dirty_definition)
	{
		dirty_definition = false;

		// Dirty definition implies all our descendent elements. Anything that can change the definition of this element can also change the
		// definition of any descendants due to the presence of RCSS descendant or child combinators. In principle this also applies to sibling
		// combinators, but those are handled during the DirtyDefinition call.
		dirty_child_definitions = true;

		GetStyle()->UpdateDefinition();
	}

	if (dirty_child_definitions)
	{
		dirty_child_definitions = false;
		for (const ElementPtr& child : children)
			child->dirty_definition = true;
	}
}